

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void google::protobuf::FileDescriptorTables::BuildLocationsByPath
               (pair<const_google::protobuf::FileDescriptorTables_*,_const_google::protobuf::SourceCodeInfo_*>
                *p)

{
  FileDescriptorTables *pFVar1;
  RepeatedPtrField<google::protobuf::SourceCodeInfo_Location> *this;
  const_reference this_00;
  lts_20250127 *this_01;
  MappedReference<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char>,_const_google::protobuf::SourceCodeInfo_Location_*>_>
  ppSVar2;
  char *in_R8;
  string_view separator;
  basic_string_view<char,_std::char_traits<char>_> local_50;
  string local_40;
  const_reference local_20;
  SourceCodeInfo_Location *loc;
  int len;
  int i;
  pair<const_google::protobuf::FileDescriptorTables_*,_const_google::protobuf::SourceCodeInfo_*>
  *p_local;
  
  loc._4_4_ = 0;
  _len = p;
  loc._0_4_ = SourceCodeInfo::location_size(p->second);
  for (; loc._4_4_ < (int)loc; loc._4_4_ = loc._4_4_ + 1) {
    this = SourceCodeInfo::location(_len->second);
    this_00 = RepeatedPtrField<google::protobuf::SourceCodeInfo_Location>::Get(this,loc._4_4_);
    pFVar1 = _len->first;
    local_20 = this_00;
    this_01 = (lts_20250127 *)SourceCodeInfo_Location::path(this_00);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_50,",");
    separator._M_str = in_R8;
    separator._M_len = (size_t)local_50._M_str;
    absl::lts_20250127::StrJoin<google::protobuf::RepeatedField<int>>
              (&local_40,this_01,(RepeatedField<int> *)local_50._M_len,separator);
    ppSVar2 = absl::lts_20250127::container_internal::
              raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::SourceCodeInfo_Location_*>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::SourceCodeInfo_Location_*>_>_>
              ::
              operator[]<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::SourceCodeInfo_Location_*>,_nullptr>
                        (&(pFVar1->locations_by_path_).
                          super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::SourceCodeInfo_Location_*>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::SourceCodeInfo_Location_*>_>_>
                         ,&local_40);
    *ppSVar2 = this_00;
    std::__cxx11::string::~string((string *)&local_40);
  }
  return;
}

Assistant:

void FileDescriptorTables::BuildLocationsByPath(
    std::pair<const FileDescriptorTables*, const SourceCodeInfo*>* p) {
  for (int i = 0, len = p->second->location_size(); i < len; ++i) {
    const SourceCodeInfo_Location* loc = &p->second->location().Get(i);
    p->first->locations_by_path_[absl::StrJoin(loc->path(), ",")] = loc;
  }
}